

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextCharFormat>::moveAppend
          (QGenericArrayOps<QTextCharFormat> *this,QTextCharFormat *b,QTextCharFormat *e)

{
  qsizetype *pqVar1;
  QTextCharFormat *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QTextCharFormat>).ptr;
    for (; b < e; b = (QTextCharFormat *)(&b->super_QTextFormat + 1)) {
      QTextFormat::QTextFormat
                (&pQVar2[(this->super_QArrayDataPointer<QTextCharFormat>).size].super_QTextFormat,
                 &b->super_QTextFormat);
      pqVar1 = &(this->super_QArrayDataPointer<QTextCharFormat>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }